

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O1

Gia_Man_t *
Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  uint *puVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  char *__s;
  bool bVar4;
  int iVar5;
  Vec_Bit_t *pVVar6;
  int *__s_00;
  void *__s_01;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *__dest;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint local_68;
  
  Gia_ManCleanMark0(p);
  uVar10 = p->nRegs;
  if ((int)uVar10 < 1) {
    uVar17 = 0;
  }
  else {
    uVar21 = 0;
    do {
      iVar26 = p->vCis->nSize;
      uVar17 = (iVar26 - uVar10) + uVar21;
      if (((int)uVar17 < 0) || (iVar26 <= (int)uVar17)) goto LAB_0051a5f9;
      iVar26 = p->vCis->pArray[uVar17];
      lVar19 = (long)iVar26;
      if ((lVar19 < 0) || (p->nObjs <= iVar26)) goto LAB_0051a5da;
      pGVar3 = p->pObjs;
      uVar17 = uVar21;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar17 = uVar21 + 1;
      *(ulong *)(pGVar3 + lVar19) =
           *(ulong *)(pGVar3 + lVar19) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar21 >> 5] >> ((byte)uVar21 & 0x1f) & 1) << 0x1e);
      uVar10 = p->nRegs;
      uVar21 = uVar17;
    } while ((int)uVar17 < (int)uVar10);
  }
  iVar26 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
  pVVar6 = (Vec_Bit_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar26 * 0x20;
  if (iVar26 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar26 * 4);
  }
  pVVar6->pArray = __s_00;
  pVVar6->nSize = iVar26 * 0x20;
  memset(__s_00,0,(long)iVar26 << 2);
  *pvInits = pVVar6;
  if (iFrEnd < 1) {
    iVar26 = 0;
  }
  else {
    iVar5 = 0;
    do {
      if ((iVar5 == iFrBeg) && (iVar26 = p->nRegs, 0 < iVar26)) {
        pVVar14 = p->vCis;
        uVar10 = 0;
        do {
          iVar11 = pVVar14->nSize;
          uVar21 = (iVar11 - iVar26) + uVar10;
          if (((int)uVar21 < 0) || (iVar11 <= (int)uVar21)) goto LAB_0051a5f9;
          iVar26 = pVVar14->pArray[uVar21];
          if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0051a5da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if ((p->pObjs[iVar26].field_0x3 & 0x40) != 0) {
            if ((*pvInits)->nSize <= (int)uVar10) goto LAB_0051a6f1;
            puVar1 = (uint *)((*pvInits)->pArray + (uVar10 >> 5));
            *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
          }
          uVar10 = uVar10 + 1;
          iVar26 = p->nRegs;
        } while ((int)uVar10 < iVar26);
      }
      pVVar14 = p->vCis;
      uVar22 = (ulong)(uint)pVVar14->nSize;
      if (p->nRegs < pVVar14->nSize) {
        lVar19 = 0;
        do {
          if ((int)uVar22 <= lVar19) goto LAB_0051a5f9;
          lVar23 = (long)pVVar14->pArray[lVar19];
          if ((lVar23 < 0) || (p->nObjs <= pVVar14->pArray[lVar19])) goto LAB_0051a5da;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar3 + lVar23) =
               *(ulong *)(pGVar3 + lVar23) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)uVar17 + lVar19) >> 5] >>
                        ((byte)((ulong)uVar17 + lVar19) & 0x1f) & 1) << 0x1e);
          lVar19 = lVar19 + 1;
          pVVar14 = p->vCis;
          uVar22 = (ulong)pVVar14->nSize;
        } while (lVar19 < (long)(uVar22 - (long)p->nRegs));
        uVar17 = uVar17 + (int)lVar19;
      }
      if (0 < p->nObjs) {
        lVar19 = 0;
        lVar23 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar22 = *(ulong *)(&pGVar3->field_0x0 + lVar19);
          if ((uVar22 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar22) {
            *(ulong *)(&pGVar3->field_0x0 + lVar19) =
                 uVar22 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar22 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar22 >> 0x1e) & 0x7ffffffc) * -3 + lVar19) >>
                          0x1e) & ((uint)(uVar22 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar22 & 0x1fffffff) << 2) * -3 +
                                           lVar19) >> 0x1e) & 1) << 0x1e);
          }
          lVar23 = lVar23 + 1;
          lVar19 = lVar19 + 0xc;
        } while (lVar23 < p->nObjs);
      }
      pVVar14 = p->vCos;
      if (0 < pVVar14->nSize) {
        lVar19 = 0;
        do {
          iVar26 = pVVar14->pArray[lVar19];
          if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0051a5da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar26;
          uVar10 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar10 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar10 & 0x1fffffff))) & 0x40000000
                      );
          lVar19 = lVar19 + 1;
          pVVar14 = p->vCos;
        } while (lVar19 < pVVar14->nSize);
      }
      iVar26 = p->nRegs;
      if (0 < iVar26) {
        iVar11 = 0;
        do {
          iVar13 = p->vCos->nSize;
          uVar10 = (iVar13 - iVar26) + iVar11;
          if (((int)uVar10 < 0) || (iVar13 <= (int)uVar10)) goto LAB_0051a5f9;
          iVar13 = p->vCos->pArray[uVar10];
          if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_0051a5da;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar10 = (iVar2 - iVar26) + iVar11;
          if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_0051a5f9;
          iVar26 = p->vCis->pArray[uVar10];
          lVar19 = (long)iVar26;
          if ((lVar19 < 0) || (p->nObjs <= iVar26)) goto LAB_0051a5da;
          *(ulong *)(pGVar3 + lVar19) =
               *(ulong *)(pGVar3 + lVar19) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar13) & 0x40000000);
          iVar11 = iVar11 + 1;
          iVar26 = p->nRegs;
        } while (iVar11 < iVar26);
      }
      iVar5 = iVar5 + 1;
      iVar26 = iFrEnd;
    } while (iVar5 != iFrEnd);
  }
  if (iVar26 != iFrEnd) {
    __assert_fail("i == iFrEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                  ,0x10b,
                  "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                 );
  }
  iVar26 = ((p->nRegs >> 5) + 1) - (uint)((p->nRegs & 0x1fU) == 0);
  if (iVar26 == 0) {
    __s_01 = (void *)0x0;
  }
  else {
    __s_01 = malloc((long)iVar26 * 4);
  }
  uVar21 = iVar26 * 0x20;
  uVar25 = 0;
  memset(__s_01,0,(long)iVar26 << 2);
  uVar10 = p->nRegs;
  if (0 < (int)uVar10) {
    pVVar14 = p->vCis;
    do {
      iVar26 = pVVar14->nSize;
      uVar12 = (uVar25 - uVar10) + iVar26;
      if (((int)uVar12 < 0) || (iVar26 <= (int)uVar12)) goto LAB_0051a5f9;
      iVar26 = pVVar14->pArray[uVar12];
      if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0051a5da;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->pObjs[iVar26].field_0x3 & 0x40) != 0) {
        if ((int)uVar21 <= (int)uVar25) {
LAB_0051a6f1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s_01 + (ulong)(uVar25 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar25 & 0x1f);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar10);
  }
  p_00 = Gia_ManStart(10000);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar7 = strlen(__s);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  iVar26 = p->nRegs;
  if (0 < iVar26) {
    iVar5 = 0;
    do {
      iVar11 = p->vCis->nSize;
      uVar10 = (iVar11 - iVar26) + iVar5;
      if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_0051a5f9;
      iVar26 = p->vCis->pArray[uVar10];
      if ((iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0051a5da;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar22 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar22 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar22 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_0051a656:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar8 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar8)) goto LAB_0051a656;
      iVar5 = iVar5 + 1;
      iVar26 = p->nRegs;
    } while (iVar5 < iVar26);
  }
  Gia_ManHashStart(p_00);
  pGVar3 = p->pObjs;
  pGVar3->Value = 1;
  pVVar14 = p->vCis;
  uVar10 = pVVar14->nSize;
  uVar25 = uVar10 - p->nRegs;
  if (uVar25 != 0 && p->nRegs <= (int)uVar10) {
    uVar16 = 0;
    uVar22 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar22 = uVar16;
    }
    do {
      if (uVar22 == uVar16) goto LAB_0051a5f9;
      iVar26 = pVVar14->pArray[uVar16];
      if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0051a5da;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar3[iVar26].Value = 1;
      uVar16 = uVar16 + 1;
    } while (uVar25 != uVar16);
  }
  if (iFrEnd <= pCex->iFrame) {
    iVar26 = iFrEnd;
    if ((int)uVar21 < 1) {
      uVar21 = 0;
    }
    do {
      iVar5 = p->nRegs;
      if (0 < iVar5) {
        uVar10 = 0;
        do {
          iVar11 = p->vCis->nSize;
          uVar25 = (iVar11 - iVar5) + uVar10;
          if (((int)uVar25 < 0) || (iVar11 <= (int)uVar25)) goto LAB_0051a5f9;
          iVar5 = p->vCis->pArray[uVar25];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0051a5da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar21 == uVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          pGVar3 = p->pObjs + iVar5;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((*(uint *)((long)__s_01 + (ulong)(uVar10 >> 5) * 4) >> ((byte)uVar10 & 0x1f)
                       & 1) << 0x1e);
          uVar10 = uVar10 + 1;
          iVar5 = p->nRegs;
        } while ((int)uVar10 < iVar5);
      }
      iVar5 = iFrEnd;
      local_68 = uVar17;
      if (iFrEnd < iVar26) {
        do {
          pVVar14 = p->vCis;
          uVar22 = (ulong)(uint)pVVar14->nSize;
          if (p->nRegs < pVVar14->nSize) {
            lVar19 = 0;
            do {
              if ((int)uVar22 <= lVar19) goto LAB_0051a5f9;
              lVar23 = (long)pVVar14->pArray[lVar19];
              if ((lVar23 < 0) || (p->nObjs <= pVVar14->pArray[lVar19])) goto LAB_0051a5da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              *(ulong *)(pGVar3 + lVar23) =
                   *(ulong *)(pGVar3 + lVar23) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar19) >> 5] >>
                            ((byte)((ulong)local_68 + lVar19) & 0x1f) & 1) << 0x1e);
              lVar19 = lVar19 + 1;
              pVVar14 = p->vCis;
              uVar22 = (ulong)pVVar14->nSize;
            } while (lVar19 < (long)(uVar22 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar19;
          }
          if (0 < p->nObjs) {
            lVar19 = 0;
            lVar23 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar22 = *(ulong *)(&pGVar3->field_0x0 + lVar19);
              if ((uVar22 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar22) {
                *(ulong *)(&pGVar3->field_0x0 + lVar19) =
                     uVar22 & 0xffffffff3fffffff |
                     (ulong)((((uint)(uVar22 >> 0x3d) ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)((uint)(uVar22 >> 0x1e) & 0x7ffffffc) * -3 + lVar19)
                              >> 0x1e) &
                              ((uint)(uVar22 >> 0x1d) & 7 ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)(uint)((int)(uVar22 & 0x1fffffff) << 2) * -3 + lVar19)
                              >> 0x1e) & 1) << 0x1e);
              }
              lVar23 = lVar23 + 1;
              lVar19 = lVar19 + 0xc;
            } while (lVar23 < p->nObjs);
          }
          pVVar14 = p->vCos;
          if (0 < pVVar14->nSize) {
            lVar19 = 0;
            do {
              iVar11 = pVVar14->pArray[lVar19];
              if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0051a5da;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar11;
              uVar10 = (uint)*(ulong *)pGVar3;
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar10 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar10 & 0x1fffffff))) &
                          0x40000000);
              lVar19 = lVar19 + 1;
              pVVar14 = p->vCos;
            } while (lVar19 < pVVar14->nSize);
          }
          iVar11 = p->nRegs;
          if (0 < iVar11) {
            iVar13 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar10 = (iVar2 - iVar11) + iVar13;
              if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_0051a5f9;
              iVar2 = p->vCos->pArray[uVar10];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0051a5da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar24 = p->vCis->nSize;
              uVar10 = (iVar24 - iVar11) + iVar13;
              if (((int)uVar10 < 0) || (iVar24 <= (int)uVar10)) goto LAB_0051a5f9;
              iVar11 = p->vCis->pArray[uVar10];
              lVar19 = (long)iVar11;
              if ((lVar19 < 0) || (p->nObjs <= iVar11)) goto LAB_0051a5da;
              *(ulong *)(pGVar3 + lVar19) =
                   *(ulong *)(pGVar3 + lVar19) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              iVar13 = iVar13 + 1;
              iVar11 = p->nRegs;
            } while (iVar13 < iVar11);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar26);
      }
      iVar5 = p->nRegs;
      if (0 < (long)iVar5) {
        pVVar14 = p->vCis;
        iVar11 = pVVar14->nSize;
        uVar22 = (ulong)(uint)(iVar11 - iVar5);
        lVar19 = 0;
        do {
          if (((int)uVar22 < 0) || (iVar11 <= (int)uVar22)) goto LAB_0051a5f9;
          iVar13 = pVVar14->pArray[uVar22];
          if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_0051a5da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          lVar23 = (long)p_00->vCis->nSize;
          if (lVar23 - p_00->nRegs <= lVar19) {
            __assert_fail("v < Gia_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
          }
          if (lVar23 <= lVar19) goto LAB_0051a5f9;
          iVar2 = p_00->vCis->pArray[lVar19];
          if (((long)iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_0051a5da;
          pGVar3 = p_00->pObjs;
          pGVar8 = (Gia_Obj_t *)((ulong)(pGVar3 + iVar2) & 0xfffffffffffffffe);
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_0051a656;
          iVar24 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2);
          if (iVar24 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          pGVar8 = p->pObjs + iVar13;
          pGVar8->Value =
               (uint)((*(uint *)pGVar8 >> 0x1e & 1) == 0) ^
               ((uint)(pGVar3 + iVar2) & 1) + iVar24 * 0x55555556;
          lVar19 = lVar19 + 1;
          uVar22 = uVar22 + 1;
        } while (iVar5 != lVar19);
      }
      iVar5 = iVar26;
      if (iVar26 <= pCex->iFrame) {
        do {
          pVVar14 = p->vCis;
          uVar22 = (ulong)(uint)pVVar14->nSize;
          if (p->nRegs < pVVar14->nSize) {
            lVar19 = 0;
            do {
              if ((int)uVar22 <= lVar19) goto LAB_0051a5f9;
              lVar23 = (long)pVVar14->pArray[lVar19];
              if ((lVar23 < 0) || (p->nObjs <= pVVar14->pArray[lVar19])) goto LAB_0051a5da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              *(ulong *)(pGVar3 + lVar23) =
                   *(ulong *)(pGVar3 + lVar23) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar19) >> 5] >>
                            ((byte)((ulong)local_68 + lVar19) & 0x1f) & 1) << 0x1e);
              lVar19 = lVar19 + 1;
              pVVar14 = p->vCis;
              uVar22 = (ulong)pVVar14->nSize;
            } while (lVar19 < (long)(uVar22 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar19;
          }
          if (0 < p->nObjs) {
            lVar23 = 8;
            lVar19 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar22 = *(ulong *)((long)pGVar3 + lVar23 + -8);
              uVar10 = (uint)uVar22;
              if ((uVar22 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
                uVar12 = (uint)(uVar22 >> 0x1d) & 7 ^
                         *(uint *)((long)pGVar3 +
                                  (ulong)(uint)((int)(uVar22 & 0x1fffffff) << 2) * -3 + lVar23 + -8)
                         >> 0x1e;
                uVar25 = (uint)(uVar22 >> 0x1e);
                uVar15 = *(uint *)((long)pGVar3 + (ulong)(uVar25 & 0x7ffffffc) * -3 + lVar23 + -8)
                         >> 0x1e & 1;
                uVar18 = (uint)(uVar22 >> 0x3d) & 1;
                uVar20 = (uVar15 ^ uVar18) & uVar12;
                *(ulong *)((long)pGVar3 + lVar23 + -8) =
                     uVar22 & 0xffffffff3fffffff | (ulong)(uVar20 << 0x1e);
                if (uVar20 == 0) {
                  if (((uVar12 & 1) == 0) && (uVar15 == uVar18)) {
                    iVar11 = Gia_ManHashOr(p_00,*(int *)((long)pGVar3 +
                                                        lVar23 + (ulong)((uVar10 & 0x1fffffff) << 2)
                                                                 * -3),
                                           *(int *)((long)pGVar3 +
                                                   lVar23 + (ulong)(uVar25 & 0x7ffffffc) * -3));
                  }
                  else {
                    if ((uVar12 & 1) == 0) {
                      uVar25 = (uVar10 & 0x1fffffff) << 2;
                    }
                    else {
                      if (uVar15 != uVar18) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                                      ,0x144,
                                      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                                     );
                      }
                      uVar25 = uVar25 & 0x7ffffffc;
                    }
                    iVar11 = *(int *)((long)pGVar3 + lVar23 + (ulong)uVar25 * -3);
                  }
                }
                else {
                  iVar11 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar3 +
                                                       lVar23 + (ulong)((uVar10 & 0x1fffffff) << 2)
                                                                * -3),
                                          *(int *)((long)pGVar3 +
                                                  lVar23 + (ulong)(uVar25 & 0x7ffffffc) * -3));
                }
                *(int *)(&pGVar3->field_0x0 + lVar23) = iVar11;
                if (iVar11 == 0) {
                  __assert_fail("pObj->Value > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                                ,0x145,
                                "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                               );
                }
              }
              lVar19 = lVar19 + 1;
              lVar23 = lVar23 + 0xc;
            } while (lVar19 < p->nObjs);
          }
          pVVar14 = p->vCos;
          if (0 < pVVar14->nSize) {
            lVar19 = 0;
            do {
              iVar11 = pVVar14->pArray[lVar19];
              if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0051a5da;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar11;
              uVar10 = (uint)*(ulong *)pGVar3;
              uVar22 = (ulong)(uVar10 & 0x1fffffff);
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar10 * 2 ^ *(uint *)(pGVar3 + -uVar22)) & 0x40000000);
              uVar10 = pGVar3[-uVar22].Value;
              pGVar3->Value = uVar10;
              if (uVar10 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                              ,0x14b,
                              "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                             );
              }
              lVar19 = lVar19 + 1;
              pVVar14 = p->vCos;
            } while (lVar19 < pVVar14->nSize);
          }
          if (iVar5 == pCex->iFrame) break;
          iVar11 = p->nRegs;
          if (0 < iVar11) {
            iVar13 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar10 = (iVar2 - iVar11) + iVar13;
              if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_0051a5f9;
              iVar2 = p->vCos->pArray[uVar10];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0051a5da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar24 = p->vCis->nSize;
              uVar10 = (iVar24 - iVar11) + iVar13;
              if (((int)uVar10 < 0) || (iVar24 <= (int)uVar10)) goto LAB_0051a5f9;
              iVar11 = p->vCis->pArray[uVar10];
              lVar19 = (long)iVar11;
              if ((lVar19 < 0) || (p->nObjs <= iVar11)) goto LAB_0051a5da;
              *(ulong *)(pGVar3 + lVar19) =
                   *(ulong *)(pGVar3 + lVar19) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              pGVar3[lVar19].Value = pGVar3[iVar2].Value;
              iVar13 = iVar13 + 1;
              iVar11 = p->nRegs;
            } while (iVar13 < iVar11);
          }
          bVar4 = iVar5 < pCex->iFrame;
          iVar5 = iVar5 + 1;
        } while (bVar4);
      }
      if (local_68 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                      ,0x155,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
      uVar10 = pCex->iPo;
      iVar5 = p->vCos->nSize;
      if (iVar5 - p->nRegs <= (int)uVar10) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar10 < 0) || (iVar5 <= (int)uVar10)) {
LAB_0051a5f9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCos->pArray[uVar10];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_0051a5da:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Gia_ManAppendCo(p_00,p->pObjs[iVar5].Value);
      bVar4 = iVar26 < pCex->iFrame;
      iVar26 = iVar26 + 1;
    } while (bVar4);
  }
  Gia_ManHashStop(p_00);
  if (__s_01 != (void *)0x0) {
    free(__s_01);
  }
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllFrames( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vInitEnd;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, i, k, iBitOld, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );
    vInitEnd = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObjRo, k )
        if ( pObjRo->fMark0 )
            Vec_BitWriteEntry( vInitEnd, k, 1 );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObjRo, k )
        Gia_ManAppendCi(pNew);
    Gia_ManHashStart( pNew );

    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;

    iBitOld = iBit;
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
    {
        // set up correct init state
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->fMark0 = Vec_BitEntry( vInitEnd, k );
        // simulate it for a few frames
        iBit = iBitOld;
        for ( i = iFrEnd; i < f; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
                pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                               (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
            Gia_ManForEachCo( p, pObj, k )
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
                pObjRo->fMark0 = pObjRi->fMark0;
        }
        // start creating values
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->Value = Abc_LitNotCond( Gia_Obj2Lit(pNew, Gia_ManPi(pNew, k)), !pObjRo->fMark0 );
        for ( i = f; i <= pCex->iFrame; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 && !fCompl1 )
                    pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 )
                    pObj->Value = Gia_ObjFanin0(pObj)->Value;
                else if ( !fCompl1 )
                    pObj->Value = Gia_ObjFanin1(pObj)->Value;
                else assert( 0 );
                assert( pObj->Value > 0 );
            }
            Gia_ManForEachCo( p, pObj, k )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
                assert( pObj->Value > 0 );
            } 
            if ( i == pCex->iFrame )
                break;
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            {
                pObjRo->fMark0 = pObjRi->fMark0;
                pObjRo->Value = pObjRi->Value;
            }
        }
        assert( iBit == pCex->nBits );
        // create PO
        Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    }
    Gia_ManHashStop( pNew );
    Vec_BitFree( vInitEnd );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}